

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void INT_EVdfg_dump_graph(EVdfg_state_type which,EVdfg dfg)

{
  long lVar1;
  
  if (which == EVdfgWorking) {
    lVar1 = 0x38;
  }
  else {
    if (which != EVdfgDeployed) {
      return;
    }
    lVar1 = 0x30;
  }
  dump_dfg_gml(*(EVdfg_configuration *)((long)&dfg->client + lVar1));
  return;
}

Assistant:

void
INT_EVdfg_dump_graph(EVdfg_state_type which, EVdfg dfg)
{
    switch(which) {
    case EVdfgWorking:
	dump_dfg_gml(dfg->working_state);
	break;
    case EVdfgDeployed:
	dump_dfg_gml(dfg->deployed_state);
	break;
    }
}